

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

int mp3dec_decode_frame(mp3dec_t *dec,uint8_t *mp3,int mp3_bytes,mp3d_sample_t *pcm,
                       mp3dec_frame_info_t *info)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *h;
  undefined1 local_3fe8 [4];
  int main_data_begin;
  mp3dec_scratch_t scratch;
  bs_t bs_frame [1];
  uint8_t *hdr;
  int success;
  int frame_size;
  int igr;
  int i;
  mp3dec_frame_info_t *info_local;
  mp3d_sample_t *pcm_local;
  uint8_t *puStack_20;
  int mp3_bytes_local;
  uint8_t *mp3_local;
  mp3dec_t *dec_local;
  
  frame_size = 0;
  hdr._4_4_ = 0;
  hdr._0_4_ = 1;
  _igr = info;
  info_local = (mp3dec_frame_info_t *)pcm;
  pcm_local._4_4_ = mp3_bytes;
  puStack_20 = mp3;
  mp3_local = (uint8_t *)dec;
  if (((4 < mp3_bytes) && (dec->header[0] == 0xff)) &&
     (iVar1 = hdr_compare(dec->header,mp3), iVar1 != 0)) {
    iVar1 = hdr_frame_bytes(puStack_20,*(int *)(mp3_local + 0x1804));
    iVar2 = hdr_padding(puStack_20);
    hdr._4_4_ = iVar1 + iVar2;
    if ((hdr._4_4_ != pcm_local._4_4_) &&
       ((pcm_local._4_4_ < hdr._4_4_ + 4 ||
        (iVar1 = hdr_compare(puStack_20,puStack_20 + hdr._4_4_), iVar1 == 0)))) {
      hdr._4_4_ = 0;
    }
  }
  if (hdr._4_4_ == 0) {
    memset(mp3_local,0,0x1a0c);
    frame_size = mp3d_find_frame(puStack_20,pcm_local._4_4_,(int *)(mp3_local + 0x1804),
                                 (int *)((long)&hdr + 4));
    if ((hdr._4_4_ == 0) || (pcm_local._4_4_ < frame_size + hdr._4_4_)) {
      _igr->frame_bytes = frame_size;
      return 0;
    }
  }
  h = puStack_20 + frame_size;
  *(undefined4 *)(mp3_local + 0x1808) = *(undefined4 *)h;
  _igr->frame_bytes = frame_size + hdr._4_4_;
  iVar1 = 2;
  if ((h[3] & 0xc0) == 0xc0) {
    iVar1 = 1;
  }
  _igr->channels = iVar1;
  uVar3 = hdr_sample_rate_hz(h);
  _igr->hz = uVar3;
  _igr->layer = 4 - ((int)(uint)h[1] >> 1 & 3U);
  uVar3 = hdr_bitrate_kbps(h);
  _igr->bitrate_kbps = uVar3;
  if (info_local == (mp3dec_frame_info_t *)0x0) {
    dec_local._4_4_ = hdr_frame_samples(h);
  }
  else {
    bs_init((bs_t *)(scratch.ist_pos[1] + 0x21),h + 4,hdr._4_4_ + -4);
    if ((h[1] & 1) == 0) {
      get_bits((bs_t *)(scratch.ist_pos[1] + 0x21),0x10);
    }
    if (_igr->layer == 3) {
      iVar1 = L3_read_side_info((bs_t *)(scratch.ist_pos[1] + 0x21),
                                (L3_gr_info_t *)(scratch.maindata + 0xaf8),h);
      if ((iVar1 < 0) || (bs_frame[0].buf._4_4_ < (int)bs_frame[0].buf)) {
        mp3dec_init((mp3dec_t *)mp3_local);
        dec_local._4_4_ = 0;
      }
      else {
        hdr._0_4_ = L3_restore_reservoir
                              ((mp3dec_t *)mp3_local,(bs_t *)(scratch.ist_pos[1] + 0x21),
                               (mp3dec_scratch_t *)local_3fe8,iVar1);
        if ((int)hdr != 0) {
          success = 0;
          while( true ) {
            iVar1 = 1;
            if ((h[1] & 8) != 0) {
              iVar1 = 2;
            }
            if (iVar1 <= success) break;
            memset(scratch.gr_info[3].region_count + 2,0,0x1200);
            L3_decode((mp3dec_t *)mp3_local,(mp3dec_scratch_t *)local_3fe8,
                      (L3_gr_info_t *)
                      (scratch.gr_info[(long)(success * _igr->channels) + -1].region_count + 2),
                      _igr->channels);
            mp3d_synth_granule((float *)(mp3_local + 0x900),
                               (float *)(scratch.gr_info[3].region_count + 2),0x12,_igr->channels,
                               (mp3d_sample_t *)info_local,scratch.scf + 0x26);
            success = success + 1;
            info_local = (mp3dec_frame_info_t *)
                         ((long)&info_local->frame_bytes + (long)(_igr->channels * 0x240) * 2);
          }
        }
        L3_save_reservoir((mp3dec_t *)mp3_local,(mp3dec_scratch_t *)local_3fe8);
        iVar1 = (int)hdr;
        uVar3 = hdr_frame_samples(mp3_local + 0x1808);
        dec_local._4_4_ = iVar1 * uVar3;
      }
    }
    else {
      dec_local._4_4_ = 0;
    }
  }
  return dec_local._4_4_;
}

Assistant:

int mp3dec_decode_frame(mp3dec_t *dec, const uint8_t *mp3, int mp3_bytes, mp3d_sample_t *pcm, mp3dec_frame_info_t *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const uint8_t *hdr;
    bs_t bs_frame[1];
    mp3dec_scratch_t scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && hdr_compare(dec->header, mp3))
    {
        frame_size = hdr_frame_bytes(mp3, dec->free_format_bytes) + hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + HDR_SIZE > mp3_bytes || !hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(mp3dec_t));
        i = mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = hdr_sample_rate_hz(hdr);
    info->layer = 4 - HDR_GET_LAYER(hdr);
    info->bitrate_kbps = hdr_bitrate_kbps(hdr);

    if (!pcm)
    {
        return hdr_frame_samples(hdr);
    }

    bs_init(bs_frame, hdr + HDR_SIZE, frame_size - HDR_SIZE);
    if (HDR_IS_CRC(hdr))
    {
        get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            mp3dec_init(dec);
            return 0;
        }
        success = L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success)
        {
            for (igr = 0; igr < (HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm += 576*info->channels)
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, pcm, scratch.syn[0]);
            }
        }
        L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MINIMP3_ONLY_MP3
        return 0;
#else /* MINIMP3_ONLY_MP3 */
        L12_scale_info sci[1];
        L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm += 384*info->channels;
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                mp3dec_init(dec);
                return 0;
            }
        }
#endif /* MINIMP3_ONLY_MP3 */
    }
    return success*hdr_frame_samples(dec->header);
}